

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

int __thiscall
fmt::v11::basic_format_args<fmt::v11::context>::get_id<char>
          (basic_format_args<fmt::v11::context> *this,basic_string_view<char> name)

{
  basic_string_view<char> rhs;
  basic_string_view<char> lhs;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  basic_string_view<char> *in_RDI;
  size_t i;
  named_arg_value<char> *named_args;
  value<fmt::v11::context> *pvVar2;
  value<fmt::v11::context> *s;
  size_t in_stack_ffffffffffffffc0;
  ulong local_30;
  
  bVar1 = has_named_args((basic_format_args<fmt::v11::context> *)in_RDI);
  if (bVar1) {
    bVar1 = is_packed((basic_format_args<fmt::v11::context> *)in_RDI);
    if (bVar1) {
      pvVar2 = ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)&in_RDI->size_
               )->values_ + -1;
    }
    else {
      pvVar2 = ((anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)&in_RDI->size_
               )->values_ + -2;
    }
    s = pvVar2;
    for (local_30 = 0; local_30 < (pvVar2->field_0).string.size; local_30 = local_30 + 1) {
      basic_string_view<char>::basic_string_view(in_RDI,(char *)s);
      lhs.size_ = in_stack_ffffffffffffffc0;
      lhs.data_ = in_RDX;
      rhs.size_ = in_RSI;
      rhs.data_ = (char *)in_RDI;
      bVar1 = operator==(lhs,rhs);
      if (bVar1) {
        return *(int *)((long)(pvVar2->field_0).pointer + local_30 * 0x10 + 8);
      }
    }
  }
  return -1;
}

Assistant:

FMT_CONSTEXPR auto get_id(basic_string_view<Char> name) const -> int {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }